

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O3

void CheckReadInt<short>(char code)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  long *plVar5;
  undefined8 *puVar6;
  size_type *psVar7;
  ulong uVar8;
  undefined8 uVar9;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual;
  char *pcVar11;
  Type_conflict1 max;
  string gtest_expected_message;
  short min;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  char local_173;
  ushort local_172;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  short local_14a;
  AssertionResult local_148;
  undefined1 local_138 [16];
  string local_128;
  internal local_108 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  string local_f8;
  double local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_148._0_8_ = (AssertHelperData *)local_138;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; ","");
  plVar5 = (long *)std::__cxx11::string::append(&local_148.success_);
  paVar2 = &local_170.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_170.field_2._M_allocated_capacity = *psVar7;
    local_170.field_2._8_8_ = plVar5[3];
    local_170._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_170.field_2._M_allocated_capacity = *psVar7;
    local_170._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_170._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  fmt::format<char>(&local_70,(CStringRef)0x26a275,&local_173);
  ReadNL((string *)((long)local_138 + 0x10),&local_70,true);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_f8,
             "std::string(\"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; \") + \"c0: 4;\"",
             "ReadNL(fmt::format(\"C0\\n{}4.2\\n\", code))",&local_170,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)local_138 + 0x10));
  paVar3 = &local_128.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_128._M_dataplus._M_p._4_4_,(int)local_128._M_dataplus._M_p) != paVar3) {
    operator_delete((undefined1 *)
                    CONCAT44(local_128._M_dataplus._M_p._4_4_,(int)local_128._M_dataplus._M_p),
                    local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((AssertHelperData *)local_148._0_8_ != (AssertHelperData *)local_138) {
    operator_delete((void *)local_148._0_8_,local_138._0_8_ + 1);
  }
  if ((char)local_f8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_170);
    if ((undefined8 *)local_f8._M_string_length == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_f8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x457,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) && (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_170._M_dataplus._M_p + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_14a = -0x8000;
  local_148._0_8_ = (AssertHelperData *)local_138;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; ","");
  local_d8 = (double)(int)local_14a;
  fmt::format<double>((string *)((long)local_138 + 0x10),(CStringRef)0x26a30c,&local_d8);
  uVar1 = (long)&((local_148.message_.ptr_)->_M_dataplus)._M_p + local_128._M_string_length;
  uVar8 = 0xf;
  if ((AssertHelperData *)local_148._0_8_ != (AssertHelperData *)local_138) {
    uVar8 = local_138._0_8_;
  }
  sVar10.ptr_ = local_148.message_.ptr_;
  if (uVar8 < uVar1) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_128._M_dataplus._M_p._4_4_,(int)local_128._M_dataplus._M_p) != paVar3) {
      uVar9 = local_128.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < uVar1) goto LAB_00164504;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)((long)local_138 + 0x10),0,(char *)0x0,local_148._0_8_);
  }
  else {
LAB_00164504:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append
                       (&local_148.success_,
                        (ulong)CONCAT44(local_128._M_dataplus._M_p._4_4_,
                                        (int)local_128._M_dataplus._M_p));
  }
  psVar7 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_170.field_2._M_allocated_capacity = *psVar7;
    local_170.field_2._8_8_ = puVar6[3];
    local_170._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_170.field_2._M_allocated_capacity = *psVar7;
    local_170._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_170._M_string_length = puVar6[1];
  *puVar6 = psVar7;
  puVar6[1] = 0;
  *(undefined1 *)psVar7 = 0;
  fmt::format<char,short>
            (&local_90,(fmt *)"C0\n{}{}\n",(CStringRef)&local_173,(char *)&local_14a,
             (short *)sVar10.ptr_);
  ReadNL(&local_f8,&local_90,true);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_108,
             "std::string(\"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; \") + fmt::format(\"c0: {};\", min + 0.)"
             ,"ReadNL(fmt::format(\"C0\\n{}{}\\n\", code, min))",&local_170,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_f8._M_dataplus._M_p._1_7_,(char)local_f8._M_dataplus._M_p) !=
      &local_f8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_f8._M_dataplus._M_p._1_7_,(char)local_f8._M_dataplus._M_p),
                    local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_128._M_dataplus._M_p._4_4_,(int)local_128._M_dataplus._M_p) != paVar3) {
    operator_delete((undefined1 *)
                    CONCAT44(local_128._M_dataplus._M_p._4_4_,(int)local_128._M_dataplus._M_p),
                    local_128.field_2._M_allocated_capacity + 1);
  }
  if ((AssertHelperData *)local_148._0_8_ != (AssertHelperData *)local_138) {
    operator_delete((void *)local_148._0_8_,local_138._0_8_ + 1);
  }
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_170);
    if (local_100.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar11 = "";
    }
    else {
      pcVar11 = ((local_100.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x45a,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) && (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_170._M_dataplus._M_p + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_100,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_172 = 0x7fff;
  local_148._0_8_ = (AssertHelperData *)local_138;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; ","");
  local_d8 = (double)local_172;
  fmt::format<double>((string *)((long)local_138 + 0x10),(CStringRef)0x26a30c,&local_d8);
  uVar1 = (long)&((local_148.message_.ptr_)->_M_dataplus)._M_p + local_128._M_string_length;
  uVar8 = 0xf;
  if ((AssertHelperData *)local_148._0_8_ != (AssertHelperData *)local_138) {
    uVar8 = local_138._0_8_;
  }
  sVar10.ptr_ = local_148.message_.ptr_;
  if (uVar8 < uVar1) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_128._M_dataplus._M_p._4_4_,(int)local_128._M_dataplus._M_p) != paVar3) {
      uVar9 = local_128.field_2._M_allocated_capacity;
    }
    if (uVar1 <= (ulong)uVar9) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)((long)local_138 + 0x10),0,(char *)0x0,local_148._0_8_);
      goto LAB_0016477a;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append
                     (&local_148.success_,
                      (ulong)CONCAT44(local_128._M_dataplus._M_p._4_4_,
                                      (int)local_128._M_dataplus._M_p));
LAB_0016477a:
  psVar7 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_170.field_2._M_allocated_capacity = *psVar7;
    local_170.field_2._8_8_ = puVar6[3];
    local_170._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_170.field_2._M_allocated_capacity = *psVar7;
    local_170._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_170._M_string_length = puVar6[1];
  *puVar6 = psVar7;
  puVar6[1] = 0;
  *(undefined1 *)psVar7 = 0;
  fmt::format<char,unsigned_short>
            (&local_b0,(fmt *)"C0\n{}{}\n",(CStringRef)&local_173,(char *)&local_172,
             (unsigned_short *)sVar10.ptr_);
  ReadNL(&local_f8,&local_b0,true);
  actual = &local_f8;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_108,
             "std::string(\"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; \") + fmt::format(\"c0: {};\", max + 0.)"
             ,"ReadNL(fmt::format(\"C0\\n{}{}\\n\", code, max))",&local_170,actual);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_f8._M_dataplus._M_p._1_7_,(char)local_f8._M_dataplus._M_p) !=
      &local_f8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_f8._M_dataplus._M_p._1_7_,(char)local_f8._M_dataplus._M_p),
                    local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_128._M_dataplus._M_p._4_4_,(int)local_128._M_dataplus._M_p) != paVar3) {
    operator_delete((undefined1 *)
                    CONCAT44(local_128._M_dataplus._M_p._4_4_,(int)local_128._M_dataplus._M_p),
                    local_128.field_2._M_allocated_capacity + 1);
  }
  if ((AssertHelperData *)local_148._0_8_ != (AssertHelperData *)local_138) {
    operator_delete((void *)local_148._0_8_,local_138._0_8_ + 1);
  }
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_170);
    if (local_100.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      actual = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x279d9a;
    }
    else {
      actual = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((local_100.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x45d,(char *)actual);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) && (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_170._M_dataplus._M_p + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_100,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((string)local_148.success_ == (string)0x1) {
    local_170._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"(input):18:2: number is too big","");
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      local_128._M_dataplus._M_p._0_4_ = local_172 + 1;
      fmt::format<char,int>
                (&local_d0,(fmt *)"C0\n{}{}\n",(CStringRef)&local_173,
                 (char *)((long)local_138 + 0x10),(int *)actual);
      ReadNL(&local_50,&local_d0,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
    }
    testing::AssertionResult::operator<<
              (&local_148,
               (char (*) [127])
               "Expected: ReadNL(fmt::format(\"C0\\n{}{}\\n\", code, max + 1)) throws an exception of type ReadError.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
  }
  testing::Message::Message((Message *)&local_170);
  if (local_148.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar11 = "";
  }
  else {
    pcVar11 = ((local_148.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)((long)local_138 + 0x10),kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x45f,pcVar11);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)((long)local_138 + 0x10),(Message *)&local_170);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)local_138 + 0x10));
  if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) && (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    (**(code **)(*(size_type *)local_170._M_dataplus._M_p + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_148.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  return;
}

Assistant:

void CheckReadInt(char code) {
  EXPECT_READ("c0: 4;", fmt::format("C0\n{}4.2\n", code));
  Int min = std::numeric_limits<Int>::min();
  EXPECT_READ(fmt::format("c0: {};", min + 0.),
               fmt::format("C0\n{}{}\n", code, min));
  typename mp::MakeUnsigned<Int>::Type max = std::numeric_limits<Int>::max();
  EXPECT_READ(fmt::format("c0: {};", max + 0.),
               fmt::format("C0\n{}{}\n", code, max));
  EXPECT_READ_ERROR(fmt::format("C0\n{}{}\n", code, max + 1),
    "(input):18:2: number is too big");
}